

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O1

void __thiscall
JsUtil::BackgroundJobProcessor::RemoveManager(BackgroundJobProcessor *this,JobManager *manager)

{
  CriticalSection *this_00;
  DoublyLinkedList<JsUtil::Job,_Memory::ArenaAllocator> *head;
  uint uVar1;
  JobProcessor *pJVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  BackgroundJobProcessor *pBVar6;
  Job *pJVar7;
  ParallelThreadData *parallelThreadData;
  undefined **ppuVar8;
  char *pcVar9;
  JobProcessor *pJVar10;
  JobProcessor *first;
  WaitableJobManager *waitableManager;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x372,"(manager)","manager");
    if (!bVar4) goto LAB_0068659a;
    *puVar5 = 0;
  }
  this_00 = &this->criticalSection;
  CCLock::Enter(&this_00->super_CCLock);
  pBVar6 = this;
  do {
    pBVar6 = (BackgroundJobProcessor *)(pBVar6->super_JobProcessor).managers.head;
    if (pBVar6 == (BackgroundJobProcessor *)manager) break;
  } while (pBVar6 != (BackgroundJobProcessor *)0x0);
  if (pBVar6 != (BackgroundJobProcessor *)0x0) {
    ppuVar8 = (undefined **)manager;
    DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>::
    UnlinkPartial<JsUtil::JobManager>
              (manager,&(this->super_JobProcessor).managers.head,
               &(this->super_JobProcessor).managers.tail);
    (manager->super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>).previous =
         (Type)0x0;
    (manager->super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>).next =
         (Type)0x0;
    if (manager->numJobsAddedToProcessor != 0) {
      head = &(this->super_JobProcessor).jobs;
      pJVar10 = (JobProcessor *)(this->super_JobProcessor).jobs.head;
      if (pJVar10 == (JobProcessor *)0x0) {
        first = (JobProcessor *)0x0;
      }
      else {
        ppuVar8 = &PTR_0155fe48;
        puVar5 = (undefined4 *)__tls_get_addr();
        first = (JobProcessor *)0x0;
        pcVar9 = (char *)ppuVar8;
        do {
          if ((pJVar10->managers).head == manager) {
            if (first == (JobProcessor *)0x0) {
              first = pJVar10;
            }
          }
          else if (first == (JobProcessor *)0x0) {
            first = (JobProcessor *)0x0;
          }
          else {
            pcVar9 = (char *)first;
            DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::
            UnlinkSubsequence<JsUtil::Job>
                      ((Job *)first,(Job *)pJVar10->_vptr_JobProcessor,&head->head,
                       &(this->super_JobProcessor).jobs.tail);
            do {
              pJVar2 = (JobProcessor *)
                       ((DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator> *)
                       &first->processesInBackground)->previous;
              if (*(char *)&(first->managers).tail == '\x01') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                pcVar9 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x395,"(!removedJob->IsCritical())","!removedJob->IsCritical()")
                ;
                if (!bVar4) goto LAB_0068659a;
                *puVar5 = 0;
              }
              if (this->numJobs == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                pcVar9 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x396,"(numJobs != 0)","numJobs != 0");
                if (!bVar4) goto LAB_0068659a;
                *puVar5 = 0;
              }
              this->numJobs = this->numJobs - 1;
              JobProcessor::JobProcessed((JobProcessor *)pcVar9,manager,(Job *)first,false);
              if (manager->numJobsAddedToProcessor == 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar5 = 1;
                pcVar9 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                ;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                                   ,0x399,"(manager->numJobsAddedToProcessor != 0)",
                                   "manager->numJobsAddedToProcessor != 0");
                if (!bVar4) goto LAB_0068659a;
                *puVar5 = 0;
              }
              manager->numJobsAddedToProcessor = manager->numJobsAddedToProcessor - 1;
              if ((manager->isWaitable == true) &&
                 ((JobProcessor *)manager[1]._vptr_JobManager == first)) {
                pcVar9 = (char *)manager[1].
                                 super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>
                                 .previous;
                SetEvent(pcVar9);
                manager[1]._vptr_JobManager = (_func_int **)0x0;
              }
              first = pJVar2;
            } while (pJVar2 != (JobProcessor *)0x0);
            first = (JobProcessor *)0x0;
          }
          pJVar10 = (JobProcessor *)
                    ((DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator> *)
                    &pJVar10->processesInBackground)->previous;
          ppuVar8 = (undefined **)pcVar9;
        } while (pJVar10 != (JobProcessor *)0x0);
      }
      if (first != (JobProcessor *)0x0) {
        DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>::
        UnlinkSubsequenceFromEnd<JsUtil::Job>
                  ((Job *)first,&head->head,&(this->super_JobProcessor).jobs.tail);
        ppuVar8 = &PTR_0155fe48;
        puVar5 = (undefined4 *)__tls_get_addr();
        do {
          pJVar10 = (JobProcessor *)
                    ((DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator> *)
                    &first->processesInBackground)->previous;
          if (*(char *)&(first->managers).tail == '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            pcVar9 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
            ;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3af,"(!removedJob->IsCritical())","!removedJob->IsCritical()");
            if (!bVar4) goto LAB_0068659a;
            *puVar5 = 0;
            ppuVar8 = (undefined **)pcVar9;
          }
          if (this->numJobs == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            pcVar9 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
            ;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3b0,"(numJobs != 0)","numJobs != 0");
            if (!bVar4) goto LAB_0068659a;
            *puVar5 = 0;
            ppuVar8 = (undefined **)pcVar9;
          }
          this->numJobs = this->numJobs - 1;
          JobProcessor::JobProcessed((JobProcessor *)ppuVar8,manager,(Job *)first,false);
          if (manager->numJobsAddedToProcessor == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            pcVar9 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
            ;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                               ,0x3b3,"(manager->numJobsAddedToProcessor != 0)",
                               "manager->numJobsAddedToProcessor != 0");
            if (!bVar4) goto LAB_0068659a;
            *puVar5 = 0;
            ppuVar8 = (undefined **)pcVar9;
          }
          manager->numJobsAddedToProcessor = manager->numJobsAddedToProcessor - 1;
          if ((manager->isWaitable == true) &&
             ((JobProcessor *)manager[1]._vptr_JobManager == first)) {
            ppuVar8 = (undefined **)
                      manager[1].
                      super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>.
                      previous;
            SetEvent(ppuVar8);
            manager[1]._vptr_JobManager = (_func_int **)0x0;
          }
          first = pJVar10;
        } while (pJVar10 != (JobProcessor *)0x0);
      }
      uVar1 = manager->numJobsAddedToProcessor;
      if (uVar1 == 0) {
        JobProcessor::LastJobProcessed((JobProcessor *)ppuVar8,manager);
      }
      else {
        if (manager->isWaitable == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3c9,"(manager->isWaitable)","manager->isWaitable");
          if (!bVar4) goto LAB_0068659a;
          *puVar5 = 0;
        }
        pJVar7 = GetCurrentJobOfManager(this,manager);
        if (pJVar7 == (Job *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3ca,"(GetCurrentJobOfManager(manager))",
                             "GetCurrentJobOfManager(manager)");
          if (!bVar4) goto LAB_0068659a;
          *puVar5 = 0;
        }
      }
      CCLock::Leave(&this_00->super_CCLock);
      if (uVar1 == 0) {
        return;
      }
      CCLock::Enter(&this_00->super_CCLock);
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pJVar7 = GetCurrentJobOfManager(this,manager);
        if (pJVar7 == (Job *)0x0) break;
        if (manager[1]._vptr_JobManager != (_func_int **)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                             ,0x3d9,"(!waitableManager->jobBeingWaitedUpon)",
                             "!waitableManager->jobBeingWaitedUpon");
          if (!bVar4) goto LAB_0068659a;
          *puVar5 = 0;
        }
        manager[1]._vptr_JobManager = (_func_int **)pJVar7;
        ResetEvent(manager[1].
                   super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>.
                   previous);
        parallelThreadData = GetThreadDataFromCurrentJob(this,(Job *)manager[1]._vptr_JobManager);
        CCLock::Leave(&this_00->super_CCLock);
        WaitWithThread(this,parallelThreadData,
                       (Event *)&manager[1].
                                 super_DoublyLinkedListElement<JsUtil::JobManager,_Memory::ArenaAllocator>
                       ,0xffffffff);
        CCLock::Enter(&this_00->super_CCLock);
        manager[1]._vptr_JobManager = (_func_int **)0x0;
      } while (pJVar7 != (Job *)0x0);
      CCLock::Leave(&this_00->super_CCLock);
      return;
    }
    pJVar7 = GetCurrentJobOfManager(this,manager);
    if (pJVar7 != (Job *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                         ,0x382,"(!GetCurrentJobOfManager(manager))",
                         "!GetCurrentJobOfManager(manager)");
      if (!bVar4) {
LAB_0068659a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  CCLock::Leave(&this_00->super_CCLock);
  return;
}

Assistant:

void BackgroundJobProcessor::RemoveManager(JobManager *const manager)
    {
        Assert(manager);

        ParallelThreadData *threadDataProcessingCurrentJob = nullptr;
        {
            AutoCriticalSection lock(&criticalSection);
            // Managers must remove themselves. Hence, Close does not remove managers. So, not asserting on !IsClosed().

            if (!HasManager(manager))
            {
                // Since this manager isn't owned by this processor, no need to remove and cleanup
                return;
            }

            managers.Unlink(manager);
            if(manager->numJobsAddedToProcessor == 0)
            {
                Assert(!GetCurrentJobOfManager(manager));
                return;
            }

            // Remove this manager's jobs from the queue
            Job *firstJob = 0;
            for(Job *job = jobs.Head(); job; job = job->Next())
            {
                if(job->Manager() == manager)
                {
                    if(!firstJob)
                        firstJob = job;
                }
                else if(firstJob)
                {
                    jobs.UnlinkSubsequence(firstJob, job->Previous());
                    for(Job *removedJob = firstJob; removedJob;)
                    {
                        Job *const next = removedJob->Next();
                        Assert(!removedJob->IsCritical());
                        Assert(numJobs != 0);
                        --numJobs;
                        JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                        Assert(manager->numJobsAddedToProcessor != 0);
                        --manager->numJobsAddedToProcessor;
                        if(manager->isWaitable)
                        {
                            WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                            if(waitableManager->jobBeingWaitedUpon == removedJob)
                            {
                                waitableManager->jobBeingWaitedUponProcessed.Set();
                                waitableManager->jobBeingWaitedUpon = 0;
                            }
                        }
                        removedJob = next;
                    }
                    firstJob = 0;
                }
            }
            if(firstJob)
            {
                jobs.UnlinkSubsequenceFromEnd(firstJob);
                for(Job *removedJob = firstJob; removedJob;)
                {
                    Job *const next = removedJob->Next();
                    Assert(!removedJob->IsCritical());
                    Assert(numJobs != 0);
                    --numJobs;
                    JobProcessed(manager, removedJob, false); // the job may be deleted during this and should not be used afterwards
                    Assert(manager->numJobsAddedToProcessor != 0);
                    --manager->numJobsAddedToProcessor;
                    if(manager->isWaitable)
                    {
                        WaitableJobManager *const waitableManager = static_cast<WaitableJobManager *>(manager);
                        if(waitableManager->jobBeingWaitedUpon == removedJob)
                        {
                            waitableManager->jobBeingWaitedUponProcessed.Set();
                            waitableManager->jobBeingWaitedUpon = 0;
                        }
                    }
                    removedJob = next;
                }
            }

            if(manager->numJobsAddedToProcessor == 0)
            {
                LastJobProcessed(manager);
                return;
            }

            Assert(manager->numJobsAddedToProcessor >= 1);
            Assert(manager->isWaitable);
            Assert(GetCurrentJobOfManager(manager));

        }

        //Wait for all the on going jobs to complete.
        criticalSection.Enter();
        while (true)
        {
            Job *job = GetCurrentJobOfManager(manager);
            if (!job)
            {
                break;
            }

            WaitableJobManager * const waitableManager = static_cast<WaitableJobManager *>(manager);
            Assert(!waitableManager->jobBeingWaitedUpon);

            waitableManager->jobBeingWaitedUpon = job;
            waitableManager->jobBeingWaitedUponProcessed.Reset();

            threadDataProcessingCurrentJob = GetThreadDataFromCurrentJob(waitableManager->jobBeingWaitedUpon);
            criticalSection.Leave();

            WaitWithThread(threadDataProcessingCurrentJob, waitableManager->jobBeingWaitedUponProcessed);

            criticalSection.Enter();
            waitableManager->jobBeingWaitedUpon = 0;
        }
        criticalSection.Leave();
    }